

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getDigits(char *zDate,char *zFormat,...)

{
  byte bVar1;
  char in_AL;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 *puVar6;
  int iVar7;
  ulong uVar8;
  char cVar9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 auStack_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  ulong local_38;
  undefined8 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_28 = (undefined1 *)auStack_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0x3000000010;
  puStack_30 = (undefined8 *)&stack0x00000008;
  iVar2 = 0;
  do {
    cVar9 = *zFormat;
    bVar1 = zFormat[3];
    if (cVar9 == '0') {
      iVar5 = 0;
    }
    else {
      pbVar3 = (byte *)zDate + (ulong)(byte)(cVar9 - 0x31) + 1;
      cVar9 = cVar9 + -0x30;
      iVar5 = 0;
      pbVar4 = (byte *)zDate;
      do {
        zDate = (char *)pbVar4;
        if ((ulong)(byte)*zDate - 0x3a < 0xfffffffffffffff6) {
          iVar7 = 6;
          goto LAB_001b83e3;
        }
        iVar5 = (int)*zDate + iVar5 * 10 + -0x30;
        pbVar4 = (byte *)zDate + 1;
        cVar9 = cVar9 + -1;
        zDate = (char *)pbVar3;
      } while (cVar9 != '\0');
    }
    iVar7 = 6;
    if ((((char)(zFormat[1] + -0x30) <= iVar5) &&
        (iVar5 <= (int)(uint)(ushort)yy_reduce_ofst[(long)zFormat[2] + 0x14d])) &&
       ((bVar1 == 0 || (bVar1 == *zDate)))) {
      uVar8 = local_38 & 0xffffffff;
      if (uVar8 < 0x29) {
        local_38 = CONCAT44(local_38._4_4_,(int)local_38 + 8);
        puVar6 = (undefined8 *)((long)auStack_e8 + uVar8);
      }
      else {
        puVar6 = puStack_30;
        puStack_30 = puStack_30 + 1;
      }
      *(int *)*puVar6 = iVar5;
      zDate = (char *)((byte *)zDate + 1);
      iVar2 = iVar2 + 1;
      zFormat = zFormat + 4;
      iVar7 = 0;
    }
LAB_001b83e3:
    if ((iVar7 != 0) || (bVar1 == 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
        auStack_e8[2] = in_RDX;
        auStack_e8[3] = in_RCX;
        local_c8 = in_R8;
        local_c0 = in_R9;
        __stack_chk_fail();
      }
      return iVar2;
    }
  } while( true );
}

Assistant:

static int getDigits(const char *zDate, const char *zFormat, ...){
  /* The aMx[] array translates the 3rd character of each format
  ** spec into a max size:    a   b   c   d   e      f */
  static const u16 aMx[] = { 12, 14, 24, 31, 59, 14712 };
  va_list ap;
  int cnt = 0;
  char nextC;
  va_start(ap, zFormat);
  do{
    char N = zFormat[0] - '0';
    char min = zFormat[1] - '0';
    int val = 0;
    u16 max;

    assert( zFormat[2]>='a' && zFormat[2]<='f' );
    max = aMx[zFormat[2] - 'a'];
    nextC = zFormat[3];
    val = 0;
    while( N-- ){
      if( !sqlite3Isdigit(*zDate) ){
        goto end_getDigits;
      }
      val = val*10 + *zDate - '0';
      zDate++;
    }
    if( val<(int)min || val>(int)max || (nextC!=0 && nextC!=*zDate) ){
      goto end_getDigits;
    }
    *va_arg(ap,int*) = val;
    zDate++;
    cnt++;
    zFormat += 4;
  }while( nextC );
end_getDigits:
  va_end(ap);
  return cnt;
}